

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

uInt longest_match(deflate_state *s,IPos cur_match)

{
  int iVar1;
  Bytef *pBVar2;
  IPos IVar3;
  Bytef *pBVar4;
  uint uVar5;
  Bytef *pBVar6;
  bool bVar7;
  uint local_60;
  Bytef local_5a;
  Bytef local_59;
  Byte scan_end;
  Byte scan_end1;
  Bytef *strend;
  uInt wmask;
  Posf *prev;
  IPos limit;
  int nice_match;
  int best_len;
  int len;
  Bytef *match;
  Bytef *scan;
  uint chain_length;
  IPos cur_match_local;
  deflate_state *s_local;
  
  scan._0_4_ = s->max_chain_length;
  match = s->window + s->strstart;
  limit = s->prev_length;
  prev._4_4_ = s->nice_match;
  if (s->w_size - 0x106 < s->strstart) {
    local_60 = s->strstart - (s->w_size - 0x106);
  }
  else {
    local_60 = 0;
  }
  pBVar4 = s->window + s->strstart;
  local_59 = match[(int)(limit - 1)];
  local_5a = match[(int)limit];
  if (s->good_match <= s->prev_length) {
    scan._0_4_ = (uint)scan >> 2;
  }
  scan._4_4_ = cur_match;
  if (s->lookahead < prev._4_4_) {
    prev._4_4_ = s->lookahead;
  }
  do {
    _best_len = s->window + scan._4_4_;
    if ((((_best_len[(int)limit] == local_5a) && (_best_len[(int)(limit - 1)] == local_59)) &&
        (*_best_len == *match)) && (_best_len[1] == match[1])) {
      match = match + 2;
      _best_len = _best_len + 2;
      do {
        bVar7 = false;
        pBVar2 = _best_len + 1;
        pBVar6 = match + 1;
        if (match[1] == _best_len[1]) {
          bVar7 = false;
          pBVar2 = _best_len + 2;
          pBVar6 = match + 2;
          if (match[2] == _best_len[2]) {
            bVar7 = false;
            pBVar2 = _best_len + 3;
            pBVar6 = match + 3;
            if (match[3] == _best_len[3]) {
              bVar7 = false;
              pBVar2 = _best_len + 4;
              pBVar6 = match + 4;
              if (match[4] == _best_len[4]) {
                bVar7 = false;
                pBVar2 = _best_len + 5;
                pBVar6 = match + 5;
                if (match[5] == _best_len[5]) {
                  bVar7 = false;
                  pBVar2 = _best_len + 6;
                  pBVar6 = match + 6;
                  if (match[6] == _best_len[6]) {
                    bVar7 = false;
                    pBVar2 = _best_len + 7;
                    pBVar6 = match + 7;
                    if (match[7] == _best_len[7]) {
                      pBVar6 = match + 8;
                      bVar7 = false;
                      pBVar2 = _best_len + 8;
                      if (match[8] == _best_len[8]) {
                        bVar7 = pBVar6 < pBVar4 + 0x102;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        match = pBVar6;
        _best_len = pBVar2;
      } while (bVar7);
      iVar1 = -((int)(pBVar4 + 0x102) - (int)match);
      IVar3 = iVar1 + 0x102;
      match = pBVar4;
      if ((int)limit < (int)IVar3) {
        s->match_start = scan._4_4_;
        limit = IVar3;
        if ((int)prev._4_4_ <= (int)IVar3) break;
        local_59 = pBVar4[iVar1 + 0x101];
        local_5a = pBVar4[(int)IVar3];
      }
    }
    uVar5 = scan._4_4_ & s->w_mask;
    scan._4_4_ = (IPos)s->prev[uVar5];
    bVar7 = false;
    if (local_60 <= scan._4_4_ && s->prev[uVar5] != local_60) {
      scan._0_4_ = (uint)scan - 1;
      bVar7 = (uint)scan != 0;
    }
  } while (bVar7);
  if (s->lookahead < limit) {
    s_local._4_4_ = s->lookahead;
  }
  else {
    s_local._4_4_ = limit;
  }
  return s_local._4_4_;
}

Assistant:

local uInt longest_match(deflate_state *s, IPos cur_match) {
    unsigned chain_length = s->max_chain_length;/* max hash chain length */
    register Bytef *scan = s->window + s->strstart; /* current string */
    register Bytef *match;                      /* matched string */
    register int len;                           /* length of current match */
    int best_len = (int)s->prev_length;         /* best match length so far */
    int nice_match = s->nice_match;             /* stop if match long enough */
    IPos limit = s->strstart > (IPos)MAX_DIST(s) ?
        s->strstart - (IPos)MAX_DIST(s) : NIL;
    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0.
     */
    Posf *prev = s->prev;
    uInt wmask = s->w_mask;

#ifdef UNALIGNED_OK
    /* Compare two bytes at a time. Note: this is not always beneficial.
     * Try with and without -DUNALIGNED_OK to check.
     */
    register Bytef *strend = s->window + s->strstart + MAX_MATCH - 1;
    register ush scan_start = *(ushf*)scan;
    register ush scan_end   = *(ushf*)(scan + best_len - 1);
#else
    register Bytef *strend = s->window + s->strstart + MAX_MATCH;
    register Byte scan_end1  = scan[best_len - 1];
    register Byte scan_end   = scan[best_len];
#endif

    /* The code is optimized for HASH_BITS >= 8 and MAX_MATCH-2 multiple of 16.
     * It is easy to get rid of this optimization if necessary.
     */
    Assert(s->hash_bits >= 8 && MAX_MATCH == 258, "Code too clever");

    /* Do not waste too much time if we already have a good match: */
    if (s->prev_length >= s->good_match) {
        chain_length >>= 2;
    }
    /* Do not look for matches beyond the end of the input. This is necessary
     * to make deflate deterministic.
     */
    if ((uInt)nice_match > s->lookahead) nice_match = (int)s->lookahead;

    Assert((ulg)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "need lookahead");

    do {
        Assert(cur_match < s->strstart, "no future");
        match = s->window + cur_match;

        /* Skip to next match if the match length cannot increase
         * or if the match length is less than 2.  Note that the checks below
         * for insufficient lookahead only occur occasionally for performance
         * reasons.  Therefore uninitialized memory will be accessed, and
         * conditional jumps will be made that depend on those values.
         * However the length of the match is limited to the lookahead, so
         * the output of deflate is not affected by the uninitialized values.
         */
#if (defined(UNALIGNED_OK) && MAX_MATCH == 258)
        /* This code assumes sizeof(unsigned short) == 2. Do not use
         * UNALIGNED_OK if your compiler uses a different size.
         */
        if (*(ushf*)(match + best_len - 1) != scan_end ||
            *(ushf*)match != scan_start) continue;

        /* It is not necessary to compare scan[2] and match[2] since they are
         * always equal when the other bytes match, given that the hash keys
         * are equal and that HASH_BITS >= 8. Compare 2 bytes at a time at
         * strstart + 3, + 5, up to strstart + 257. We check for insufficient
         * lookahead only every 4th comparison; the 128th check will be made
         * at strstart + 257. If MAX_MATCH-2 is not a multiple of 8, it is
         * necessary to put more guard bytes at the end of the window, or
         * to check more often for insufficient lookahead.
         */
        if (!s->chromium_zlib_hash) {
          Assert(scan[2] == match[2], "scan[2]?");
        } else {
          /* When using CRC hashing, scan[2] and match[2] may mismatch, but in
           * that case at least one of the other hashed bytes will mismatch
           * also. Bytes 0 and 1 were already checked above, and we know there
           * are at least four bytes to check otherwise the mismatch would have
           * been found by the scan_end comparison above, so: */
          Assert(scan[2] == match[2] || scan[3] != match[3], "scan[2]??");
        }
        scan++, match++;
        do {
        } while (*(ushf*)(scan += 2) == *(ushf*)(match += 2) &&
                 *(ushf*)(scan += 2) == *(ushf*)(match += 2) &&
                 *(ushf*)(scan += 2) == *(ushf*)(match += 2) &&
                 *(ushf*)(scan += 2) == *(ushf*)(match += 2) &&
                 scan < strend);
        /* The funny "do {}" generates better code on most compilers */

        /* Here, scan <= window + strstart + 257 */
        Assert(scan <= s->window+(unsigned)(s->window_size - 1),
               "wild scan");
        if (*scan == *match) scan++;

        len = (MAX_MATCH - 1) - (int)(strend - scan);
        scan = strend - (MAX_MATCH-1);

#else /* UNALIGNED_OK */

        if (match[best_len]   != scan_end  ||
            match[best_len - 1] != scan_end1 ||
            *match            != *scan     ||
            *++match          != scan[1])      continue;

        /* The check at best_len - 1 can be removed because it will be made
         * again later. (This heuristic is not always a win.)
         * It is not necessary to compare scan[2] and match[2] since they
         * are always equal when the other bytes match, given that
         * the hash keys are equal and that HASH_BITS >= 8.
         */
        scan += 2, match++;
        if (!s->chromium_zlib_hash) {
          Assert(*scan == *match, "match[2]?");
        } else {
          /* When using CRC hashing, scan[2] and match[2] may mismatch, but in
           * that case at least one of the other hashed bytes will mismatch
           * also. Bytes 0 and 1 were already checked above, and we know there
           * are at least four bytes to check otherwise the mismatch would have
           * been found by the scan_end comparison above, so: */
          Assert(*scan == *match || scan[1] != match[1], "match[2]??");
        }

        /* We check for insufficient lookahead only every 8th comparison;
         * the 256th check will be made at strstart + 258.
         */
        do {
        } while (*++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match &&
                 scan < strend);

        Assert(scan <= s->window + (unsigned)(s->window_size - 1),
               "wild scan");

        len = MAX_MATCH - (int)(strend - scan);
        scan = strend - MAX_MATCH;

#endif /* UNALIGNED_OK */

        if (len > best_len) {
            s->match_start = cur_match;
            best_len = len;
            if (len >= nice_match) break;
#ifdef UNALIGNED_OK
            scan_end = *(ushf*)(scan + best_len - 1);
#else
            scan_end1  = scan[best_len - 1];
            scan_end   = scan[best_len];
#endif
        }
    } while ((cur_match = prev[cur_match & wmask]) > limit
             && --chain_length != 0);

    if ((uInt)best_len <= s->lookahead) return (uInt)best_len;
    return s->lookahead;
}